

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O1

sunrealtype N_VMaxNorm_Serial(N_Vector x)

{
  long lVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  
  lVar1 = *x->content;
  if (0 < lVar1) {
    lVar2 = 0;
    dVar4 = 0.0;
    do {
      dVar3 = ABS(*(double *)(*(long *)((long)x->content + 0x10) + lVar2 * 8));
      if (dVar3 <= dVar4) {
        dVar3 = dVar4;
      }
      lVar2 = lVar2 + 1;
      dVar4 = dVar3;
    } while (lVar1 != lVar2);
    return dVar3;
  }
  return 0.0;
}

Assistant:

sunrealtype N_VMaxNorm_Serial(N_Vector x)
{
  sunindextype i, N;
  sunrealtype max, *xd;

  max = ZERO;
  xd  = NULL;

  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);

  for (i = 0; i < N; i++)
  {
    if (SUNRabs(xd[i]) > max) { max = SUNRabs(xd[i]); }
  }

  return (max);
}